

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Vec_Int_t * Abc_NtkFanoutCounts(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0;
  pVVar5->nSize = 0;
  pVVar5->pArray = (int *)0x0;
  pVVar2 = pNtk->vObjs;
  iVar1 = pVVar2->nSize;
  lVar9 = (long)iVar1;
  if (0 < lVar9) {
    piVar6 = (int *)malloc(lVar9 * 4);
    pVVar5->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar1;
    if (0 < iVar1) {
      memset(pVVar5->pArray,0xff,lVar9 * 4);
    }
  }
  pVVar5->nSize = iVar1;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar7 = 0;
    do {
      pvVar4 = ppvVar3[lVar7];
      if (((pvVar4 != (void *)0x0) && (uVar8 = *(uint *)((long)pvVar4 + 0x14) & 0xf, uVar8 < 8)) &&
         ((0xa4U >> uVar8 & 1) != 0)) {
        if (lVar9 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar5->pArray[lVar7] = *(int *)((long)pvVar4 + 0x2c);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar2->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkFanoutCounts( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vFanNums;
    Abc_Obj_t * pObj;
    int i;
    vFanNums = Vec_IntAlloc( 0 );
    Vec_IntFill( vFanNums, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
            Vec_IntWriteEntry( vFanNums, i, Abc_ObjFanoutNum(pObj) );
    return vFanNums;
}